

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.h
# Opt level: O0

ByteData * __thiscall
cfd::core::ByteData160::Join<cfd::core::ByteData,cfd::core::ByteData160,cfd::core::ByteData256>
          (ByteData *__return_storage_ptr__,ByteData160 *this,ByteData *top,ByteData160 *args,
          ByteData256 *args_1)

{
  undefined1 local_48 [8];
  ByteData result;
  ByteData256 *args_local_1;
  ByteData160 *args_local;
  ByteData *top_local;
  ByteData160 *this_local;
  
  result.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)args_1;
  Join<cfd::core::ByteData>((ByteData *)local_48,this,top);
  ByteData::Join<cfd::core::ByteData160,cfd::core::ByteData256>
            (__return_storage_ptr__,(ByteData *)local_48,args,
             (ByteData256 *)
             result.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  ByteData::~ByteData((ByteData *)local_48);
  return __return_storage_ptr__;
}

Assistant:

ByteData Join(const ByteTop& top, const ByteDataClass&... args) const {
    ByteData result = Join(top);
    return result.Join(args...);
  }